

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  int y;
  int iVar1;
  bool bVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  piVar3 = (this->heap).data;
  y = piVar3[i];
  while( true ) {
    iVar7 = i * 2 + 1;
    iVar1 = (this->heap).sz;
    if (iVar1 <= iVar7) break;
    iVar6 = i * 2 + 2;
    if (iVar6 < iVar1) {
      bVar2 = SimpSolver::ElimLt::operator()(&this->lt,piVar3[iVar6],piVar3[iVar7]);
      lVar5 = (long)iVar6;
      if (!bVar2) {
        lVar5 = (long)iVar7;
        iVar6 = iVar7;
      }
    }
    else {
      lVar5 = (long)iVar7;
      iVar6 = iVar7;
    }
    bVar2 = SimpSolver::ElimLt::operator()(&this->lt,(this->heap).data[lVar5],y);
    piVar3 = (this->heap).data;
    piVar4 = (this->indices).map.data;
    if (!bVar2) goto LAB_004d142d;
    iVar1 = piVar3[lVar5];
    piVar3[i] = iVar1;
    piVar4[iVar1] = i;
    i = iVar6;
  }
  piVar4 = (this->indices).map.data;
LAB_004d142d:
  piVar3[i] = y;
  piVar4[y] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }